

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fwd_txfm_impl_sse2.h
# Opt level: O2

void fdct4x4_helper(int16_t *input,int stride,__m128i *in0,__m128i *in1)

{
  longlong lVar1;
  longlong lVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  __m128i alVar11;
  undefined1 auVar12 [16];
  ushort uVar13;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  __m128i alVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  (*in0)[0] = *(longlong *)input;
  (*in0)[1] = 0;
  lVar1 = *(longlong *)(input + stride);
  (*in1)[0] = lVar1;
  (*in1)[1] = 0;
  lVar2 = *(longlong *)(input + stride * 2);
  (*in1)[0] = lVar1;
  (*in1)[1] = lVar2;
  auVar12._8_8_ = *(undefined8 *)(input + stride * 3);
  auVar12._0_8_ = (*in0)[0];
  alVar11 = (__m128i)psllw(auVar12,4);
  *in0 = alVar11;
  alVar11 = (__m128i)psllw((undefined1  [16])*in1,4);
  *in1 = alVar11;
  sVar3 = (short)(*in0)[0];
  uVar19 = *(ushort *)((long)*in0 + 2);
  uVar20 = *(ushort *)((long)*in0 + 4);
  uVar21 = *(ushort *)((long)*in0 + 6);
  uVar22 = (ushort)(*in0)[1];
  uVar23 = *(ushort *)((long)*in0 + 10);
  uVar24 = *(ushort *)((long)*in0 + 0xc);
  uVar25 = *(ushort *)((long)*in0 + 0xe);
  uVar13 = ~-(ushort)(sVar3 == 0) & sVar3 + 1U;
  uVar19 = ~-(ushort)(uVar19 == 1) & uVar19;
  uVar20 = ~-(ushort)(uVar20 == 1) & uVar20;
  uVar21 = ~-(ushort)(uVar21 == 1) & uVar21;
  uVar22 = ~-(ushort)(uVar22 == 1) & uVar22;
  uVar23 = ~-(ushort)(uVar23 == 1) & uVar23;
  uVar24 = ~-(ushort)(uVar24 == 1) & uVar24;
  uVar25 = ~-(ushort)(uVar25 == 1) & uVar25;
  *(ushort *)*in0 = uVar13;
  *(ushort *)((long)*in0 + 2) = uVar19;
  *(ushort *)((long)*in0 + 4) = uVar20;
  *(ushort *)((long)*in0 + 6) = uVar21;
  *(ushort *)(*in0 + 1) = uVar22;
  *(ushort *)((long)*in0 + 10) = uVar23;
  *(ushort *)((long)*in0 + 0xc) = uVar24;
  *(ushort *)((long)*in0 + 0xe) = uVar25;
  sVar3 = (short)(*in1)[0];
  sVar4 = *(short *)((long)*in1 + 2);
  sVar5 = *(short *)((long)*in1 + 4);
  sVar6 = *(short *)((long)*in1 + 6);
  sVar7 = (short)(*in1)[1];
  sVar8 = *(short *)((long)*in1 + 10);
  sVar9 = *(short *)((long)*in1 + 0xc);
  sVar10 = *(short *)((long)*in1 + 0xe);
  auVar14._0_2_ = uVar13 + uVar22;
  auVar14._2_2_ = sVar3 + sVar7;
  auVar14._4_2_ = uVar19 + uVar23;
  auVar14._6_2_ = sVar4 + sVar8;
  auVar14._8_2_ = uVar21 + uVar25;
  auVar14._10_2_ = sVar6 + sVar10;
  auVar14._12_2_ = uVar20 + uVar24;
  auVar14._14_2_ = sVar5 + sVar9;
  auVar28._0_2_ = uVar13 - uVar22;
  auVar28._2_2_ = sVar3 - sVar7;
  auVar28._4_2_ = uVar19 - uVar23;
  auVar28._6_2_ = sVar4 - sVar8;
  auVar28._8_2_ = uVar21 - uVar25;
  auVar28._10_2_ = sVar6 - sVar10;
  auVar28._12_2_ = uVar20 - uVar24;
  auVar28._14_2_ = sVar5 - sVar9;
  auVar26 = pmaddwd(_DAT_0046d860,auVar14);
  auVar15 = pmaddwd(auVar14,_DAT_0046d870);
  auVar31 = pmaddwd(_DAT_0046d880,auVar28);
  auVar12 = pmaddwd(auVar28,_DAT_0046d890);
  auVar27._0_4_ = auVar26._0_4_ + 0x2000 >> 0xe;
  auVar27._4_4_ = auVar26._4_4_ + 0x2000 >> 0xe;
  auVar27._8_4_ = auVar26._8_4_ + 0x2000 >> 0xe;
  auVar27._12_4_ = auVar26._12_4_ + 0x2000 >> 0xe;
  auVar32._0_4_ = auVar31._0_4_ + 0x2000 >> 0xe;
  auVar32._4_4_ = auVar31._4_4_ + 0x2000 >> 0xe;
  auVar32._8_4_ = auVar31._8_4_ + 0x2000 >> 0xe;
  auVar32._12_4_ = auVar31._12_4_ + 0x2000 >> 0xe;
  auVar28 = packssdw(auVar27,auVar32);
  auVar16._0_4_ = auVar15._0_4_ + 0x2000 >> 0xe;
  auVar16._4_4_ = auVar15._4_4_ + 0x2000 >> 0xe;
  auVar16._8_4_ = auVar15._8_4_ + 0x2000 >> 0xe;
  auVar16._12_4_ = auVar15._12_4_ + 0x2000 >> 0xe;
  auVar15._0_4_ = auVar12._0_4_ + 0x2000 >> 0xe;
  auVar15._4_4_ = auVar12._4_4_ + 0x2000 >> 0xe;
  auVar15._8_4_ = auVar12._8_4_ + 0x2000 >> 0xe;
  auVar15._12_4_ = auVar12._12_4_ + 0x2000 >> 0xe;
  auVar12 = packssdw(auVar16,auVar15);
  *(int *)*in0 = auVar28._0_4_;
  *(int *)((long)*in0 + 4) = auVar28._8_4_;
  *(int *)(*in0 + 1) = auVar28._4_4_;
  *(int *)((long)*in0 + 0xc) = auVar28._12_4_;
  *(int *)*in1 = auVar12._4_4_;
  *(int *)((long)*in1 + 4) = auVar12._12_4_;
  *(int *)(*in1 + 1) = auVar12._0_4_;
  *(int *)((long)*in1 + 0xc) = auVar12._8_4_;
  sVar3 = (short)(*in0)[0];
  sVar4 = *(short *)((long)*in0 + 2);
  sVar5 = *(short *)((long)*in0 + 4);
  sVar6 = *(short *)((long)*in0 + 6);
  sVar7 = (short)(*in0)[1];
  sVar8 = *(short *)((long)*in0 + 10);
  sVar9 = *(short *)((long)*in0 + 0xc);
  sVar10 = *(short *)((long)*in0 + 0xe);
  auVar26._0_2_ = sVar3 + auVar12._4_2_;
  auVar26._2_2_ = sVar4 + auVar12._6_2_;
  auVar26._4_2_ = sVar5 + auVar12._12_2_;
  auVar26._6_2_ = sVar6 + auVar12._14_2_;
  auVar26._8_2_ = sVar7 + auVar12._0_2_;
  auVar26._10_2_ = sVar8 + auVar12._2_2_;
  auVar26._12_2_ = sVar9 + auVar12._8_2_;
  auVar26._14_2_ = sVar10 + auVar12._10_2_;
  auVar17._0_2_ = sVar3 - auVar12._4_2_;
  auVar17._2_2_ = sVar4 - auVar12._6_2_;
  auVar17._4_2_ = sVar5 - auVar12._12_2_;
  auVar17._6_2_ = sVar6 - auVar12._14_2_;
  auVar17._8_2_ = sVar7 - auVar12._0_2_;
  auVar17._10_2_ = sVar8 - auVar12._2_2_;
  auVar17._12_2_ = sVar9 - auVar12._8_2_;
  auVar17._14_2_ = sVar10 - auVar12._10_2_;
  auVar15 = pmaddwd(_DAT_0046d8b0,auVar26);
  auVar12 = pmaddwd(auVar26,_DAT_0046d8c0);
  auVar26 = pmaddwd(_DAT_0046d8d0,auVar17);
  auVar28 = pmaddwd(auVar17,_DAT_0046d8e0);
  auVar29._0_4_ = auVar15._0_4_ + 0x6000 >> 0x10;
  auVar29._4_4_ = auVar15._4_4_ + 0x6000 >> 0x10;
  auVar29._8_4_ = auVar15._8_4_ + 0x6000 >> 0x10;
  auVar29._12_4_ = auVar15._12_4_ + 0x6000 >> 0x10;
  auVar31._0_4_ = auVar12._0_4_ + 0x6000 >> 0x10;
  auVar31._4_4_ = auVar12._4_4_ + 0x6000 >> 0x10;
  auVar31._8_4_ = auVar12._8_4_ + 0x6000 >> 0x10;
  auVar31._12_4_ = auVar12._12_4_ + 0x6000 >> 0x10;
  auVar33._0_4_ = auVar26._0_4_ + 0x6000 >> 0x10;
  auVar33._4_4_ = auVar26._4_4_ + 0x6000 >> 0x10;
  auVar33._8_4_ = auVar26._8_4_ + 0x6000 >> 0x10;
  auVar33._12_4_ = auVar26._12_4_ + 0x6000 >> 0x10;
  alVar30 = (__m128i)packssdw(auVar29,auVar33);
  auVar18._0_4_ = auVar28._0_4_ + 0x6000 >> 0x10;
  auVar18._4_4_ = auVar28._4_4_ + 0x6000 >> 0x10;
  auVar18._8_4_ = auVar28._8_4_ + 0x6000 >> 0x10;
  auVar18._12_4_ = auVar28._12_4_ + 0x6000 >> 0x10;
  alVar11 = (__m128i)packssdw(auVar31,auVar18);
  *in0 = alVar30;
  *in1 = alVar11;
  return;
}

Assistant:

static void FDCT4x4_2D_HELPER(const int16_t *input, int stride, __m128i *in0,
                              __m128i *in1) {
  // Constants
  // These are the coefficients used for the multiplies.
  // In the comments, pN means cos(N pi /64) and mN is -cos(N pi /64),
  // where cospi_N_64 = cos(N pi /64)
  const __m128i k__cospi_A =
      octa_set_epi16(cospi_16_64, cospi_16_64, cospi_16_64, cospi_16_64,
                     cospi_16_64, -cospi_16_64, cospi_16_64, -cospi_16_64);
  const __m128i k__cospi_B =
      octa_set_epi16(cospi_16_64, -cospi_16_64, cospi_16_64, -cospi_16_64,
                     cospi_16_64, cospi_16_64, cospi_16_64, cospi_16_64);
  const __m128i k__cospi_C =
      octa_set_epi16(cospi_8_64, cospi_24_64, cospi_8_64, cospi_24_64,
                     cospi_24_64, -cospi_8_64, cospi_24_64, -cospi_8_64);
  const __m128i k__cospi_D =
      octa_set_epi16(cospi_24_64, -cospi_8_64, cospi_24_64, -cospi_8_64,
                     cospi_8_64, cospi_24_64, cospi_8_64, cospi_24_64);
  const __m128i k__cospi_E =
      octa_set_epi16(cospi_16_64, cospi_16_64, cospi_16_64, cospi_16_64,
                     cospi_16_64, cospi_16_64, cospi_16_64, cospi_16_64);
  const __m128i k__cospi_F =
      octa_set_epi16(cospi_16_64, -cospi_16_64, cospi_16_64, -cospi_16_64,
                     cospi_16_64, -cospi_16_64, cospi_16_64, -cospi_16_64);
  const __m128i k__cospi_G =
      octa_set_epi16(cospi_8_64, cospi_24_64, cospi_8_64, cospi_24_64,
                     -cospi_8_64, -cospi_24_64, -cospi_8_64, -cospi_24_64);
  const __m128i k__cospi_H =
      octa_set_epi16(cospi_24_64, -cospi_8_64, cospi_24_64, -cospi_8_64,
                     -cospi_24_64, cospi_8_64, -cospi_24_64, cospi_8_64);

  const __m128i k__DCT_CONST_ROUNDING = _mm_set1_epi32(DCT_CONST_ROUNDING);
  // This second rounding constant saves doing some extra adds at the end
  const __m128i k__DCT_CONST_ROUNDING2 =
      _mm_set1_epi32(DCT_CONST_ROUNDING + (DCT_CONST_ROUNDING << 1));
  const int DCT_CONST_BITS2 = DCT_CONST_BITS + 2;
  const __m128i k__nonzero_bias_a = _mm_setr_epi16(0, 1, 1, 1, 1, 1, 1, 1);
  const __m128i k__nonzero_bias_b = _mm_setr_epi16(1, 0, 0, 0, 0, 0, 0, 0);

  // Load inputs.
  *in0 = _mm_loadl_epi64((const __m128i *)(input + 0 * stride));
  *in1 = _mm_loadl_epi64((const __m128i *)(input + 1 * stride));
  *in1 = _mm_unpacklo_epi64(
      *in1, _mm_loadl_epi64((const __m128i *)(input + 2 * stride)));
  *in0 = _mm_unpacklo_epi64(
      *in0, _mm_loadl_epi64((const __m128i *)(input + 3 * stride)));
  // in0 = [i0 i1 i2 i3 iC iD iE iF]
  // in1 = [i4 i5 i6 i7 i8 i9 iA iB]
  // multiply by 16 to give some extra precision
  *in0 = _mm_slli_epi16(*in0, 4);
  *in1 = _mm_slli_epi16(*in1, 4);
  // if (i == 0 && input[0]) input[0] += 1;
  // add 1 to the upper left pixel if it is non-zero, which helps reduce
  // the round-trip error
  {
    // The mask will only contain whether the first value is zero, all
    // other comparison will fail as something shifted by 4 (above << 4)
    // can never be equal to one. To increment in the non-zero case, we
    // add the mask and one for the first element:
    //   - if zero, mask = -1, v = v - 1 + 1 = v
    //   - if non-zero, mask = 0, v = v + 0 + 1 = v + 1
    __m128i mask = _mm_cmpeq_epi16(*in0, k__nonzero_bias_a);
    *in0 = _mm_add_epi16(*in0, mask);
    *in0 = _mm_add_epi16(*in0, k__nonzero_bias_b);
  }
  // There are 4 total stages, alternating between an add/subtract stage
  // followed by an multiply-and-add stage.
  {
    // Stage 1: Add/subtract

    // in0 = [i0 i1 i2 i3 iC iD iE iF]
    // in1 = [i4 i5 i6 i7 i8 i9 iA iB]
    const __m128i r0 = _mm_unpacklo_epi16(*in0, *in1);
    const __m128i r1 = _mm_unpackhi_epi16(*in0, *in1);
    // r0 = [i0 i4 i1 i5 i2 i6 i3 i7]
    // r1 = [iC i8 iD i9 iE iA iF iB]
    const __m128i r2 = _mm_shuffle_epi32(r0, 0xB4);
    const __m128i r3 = _mm_shuffle_epi32(r1, 0xB4);
    // r2 = [i0 i4 i1 i5 i3 i7 i2 i6]
    // r3 = [iC i8 iD i9 iF iB iE iA]

    const __m128i t0 = _mm_add_epi16(r2, r3);
    const __m128i t1 = _mm_sub_epi16(r2, r3);
    // t0 = [a0 a4 a1 a5 a3 a7 a2 a6]
    // t1 = [aC a8 aD a9 aF aB aE aA]

    // Stage 2: multiply by constants (which gets us into 32 bits).
    // The constants needed here are:
    // k__cospi_A = [p16 p16 p16 p16 p16 m16 p16 m16]
    // k__cospi_B = [p16 m16 p16 m16 p16 p16 p16 p16]
    // k__cospi_C = [p08 p24 p08 p24 p24 m08 p24 m08]
    // k__cospi_D = [p24 m08 p24 m08 p08 p24 p08 p24]
    const __m128i u0 = _mm_madd_epi16(t0, k__cospi_A);
    const __m128i u2 = _mm_madd_epi16(t0, k__cospi_B);
    const __m128i u1 = _mm_madd_epi16(t1, k__cospi_C);
    const __m128i u3 = _mm_madd_epi16(t1, k__cospi_D);
    // Then add and right-shift to get back to 16-bit range
    const __m128i v0 = _mm_add_epi32(u0, k__DCT_CONST_ROUNDING);
    const __m128i v1 = _mm_add_epi32(u1, k__DCT_CONST_ROUNDING);
    const __m128i v2 = _mm_add_epi32(u2, k__DCT_CONST_ROUNDING);
    const __m128i v3 = _mm_add_epi32(u3, k__DCT_CONST_ROUNDING);
    const __m128i w0 = _mm_srai_epi32(v0, DCT_CONST_BITS);
    const __m128i w1 = _mm_srai_epi32(v1, DCT_CONST_BITS);
    const __m128i w2 = _mm_srai_epi32(v2, DCT_CONST_BITS);
    const __m128i w3 = _mm_srai_epi32(v3, DCT_CONST_BITS);
    // w0 = [b0 b1 b7 b6]
    // w1 = [b8 b9 bF bE]
    // w2 = [b4 b5 b3 b2]
    // w3 = [bC bD bB bA]
    const __m128i x0 = _mm_packs_epi32(w0, w1);
    const __m128i x1 = _mm_packs_epi32(w2, w3);

    // x0 = [b0 b1 b7 b6 b8 b9 bF bE]
    // x1 = [b4 b5 b3 b2 bC bD bB bA]
    *in0 = _mm_shuffle_epi32(x0, 0xD8);
    *in1 = _mm_shuffle_epi32(x1, 0x8D);
    // in0 = [b0 b1 b8 b9 b7 b6 bF bE]
    // in1 = [b3 b2 bB bA b4 b5 bC bD]
  }
  {
    // vertical DCTs finished. Now we do the horizontal DCTs.
    // Stage 3: Add/subtract

    const __m128i t0 = ADD_EPI16(*in0, *in1);
    const __m128i t1 = SUB_EPI16(*in0, *in1);

    // Stage 4: multiply by constants (which gets us into 32 bits).
    {
      // The constants needed here are:
      // k__cospi_E = [p16 p16 p16 p16 p16 p16 p16 p16]
      // k__cospi_F = [p16 m16 p16 m16 p16 m16 p16 m16]
      // k__cospi_G = [p08 p24 p08 p24 m08 m24 m08 m24]
      // k__cospi_H = [p24 m08 p24 m08 m24 p08 m24 p08]
      const __m128i u0 = _mm_madd_epi16(t0, k__cospi_E);
      const __m128i u1 = _mm_madd_epi16(t0, k__cospi_F);
      const __m128i u2 = _mm_madd_epi16(t1, k__cospi_G);
      const __m128i u3 = _mm_madd_epi16(t1, k__cospi_H);
      // Then add and right-shift to get back to 16-bit range
      // but this combines the final right-shift as well to save operations
      // This unusual rounding operations is to maintain bit-accurate
      // compatibility with the c version of this function which has two
      // rounding steps in a row.
      const __m128i v0 = _mm_add_epi32(u0, k__DCT_CONST_ROUNDING2);
      const __m128i v1 = _mm_add_epi32(u1, k__DCT_CONST_ROUNDING2);
      const __m128i v2 = _mm_add_epi32(u2, k__DCT_CONST_ROUNDING2);
      const __m128i v3 = _mm_add_epi32(u3, k__DCT_CONST_ROUNDING2);
      const __m128i w0 = _mm_srai_epi32(v0, DCT_CONST_BITS2);
      const __m128i w1 = _mm_srai_epi32(v1, DCT_CONST_BITS2);
      const __m128i w2 = _mm_srai_epi32(v2, DCT_CONST_BITS2);
      const __m128i w3 = _mm_srai_epi32(v3, DCT_CONST_BITS2);
      *in0 = _mm_packs_epi32(w0, w2);
      *in1 = _mm_packs_epi32(w1, w3);
    }
  }
}